

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_regex.cpp
# Opt level: O2

void __thiscall duckdb_re2::Regex::Regex(Regex *this,string *pattern,RegexOptions options)

{
  undefined7 in_register_00000011;
  StringPiece SStack_48;
  Options local_38;
  undefined4 local_20;
  undefined2 local_1c;
  undefined1 local_1a;
  undefined4 local_19;
  undefined1 local_15;
  undefined2 local_14;
  undefined1 local_12;
  
  (this->regex).internal.super___shared_ptr<duckdb_re2::RE2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->regex).internal.super___shared_ptr<duckdb_re2::RE2,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38.never_nl_ = false;
  local_38.dot_nl_ = false;
  local_38.never_capture_ = true;
  local_38.case_sensitive_ = false;
  local_38.perl_classes_ = false;
  local_38.word_boundary_ = false;
  local_38.one_line_ = false;
  local_38._23_1_ = 0;
  local_20 = 1;
  local_1c = 0;
  local_1a = 1;
  local_19 = 0;
  local_14 = 0;
  local_12 = 0;
  local_15 = (int)CONCAT71(in_register_00000011,options) == 1;
  local_38.max_mem_ = (int64_t)(pattern->_M_dataplus)._M_p;
  local_38._8_8_ = pattern->_M_string_length;
  duckdb::make_shared_ptr<duckdb_re2::RE2,duckdb_re2::StringPiece,duckdb_re2::RE2::Options&>
            (&SStack_48,&local_38);
  duckdb::shared_ptr<duckdb_re2::RE2,_true>::operator=
            (&this->regex,(shared_ptr<duckdb_re2::RE2,_true> *)&SStack_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&SStack_48.size_);
  return;
}

Assistant:

Regex::Regex(const std::string &pattern, RegexOptions options) {
	RE2::Options o;
	o.set_case_sensitive(options == RegexOptions::CASE_INSENSITIVE);
	regex = duckdb::make_shared_ptr<duckdb_re2::RE2>(StringPiece(pattern), o);
}